

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O1

void __thiscall OpenMD::NPT::NPT(NPT *this,SimInfo *info)

{
  SimInfo *pSVar1;
  Globals *pGVar2;
  Snapshot *this_00;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  Mat3x3d local_68;
  
  VelocityVerletIntegrator::VelocityVerletIntegrator(&this->super_VelocityVerletIntegrator,info);
  (this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPT_002fd860;
  (this->oldPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldVel).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldVel).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldVel).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldJi).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldJi).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldJi).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->etaTolerance = 1e-06;
  (this->thermostat).first = 0.0;
  (this->thermostat).second = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  this->chiTolerance = 1e-06;
  this->maxIterNum_ = 4;
  pSVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.info_;
  pGVar2 = pSVar1->simParams_;
  if ((pGVar2->UseIntialExtendedSystemState).super_ParameterBase.field_0x2b == '\0') {
    this_00 = pSVar1->sman_->currentSnapshot_;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    Snapshot::setThermostat(this_00,(pair<double,_double> *)&local_68);
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    Snapshot::setBarostat(this_00,&local_68);
  }
  if ((pGVar2->TargetTemp).super_ParameterBase.empty_ == true) {
    builtin_strncpy(painCave.errMsg,"You can\'t use the NVT integrator without a targetTemp!\n",0x38
                   );
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->targetTemp = (pGVar2->TargetTemp).data_;
  }
  if ((pGVar2->TauThermostat).super_ParameterBase.empty_ == true) {
    memcpy(&painCave,
           "If you use the constant temperature\n\tintegrator, you must set tauThermostat.\n",0x4e);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->tauThermostat = (pGVar2->TauThermostat).data_;
  }
  if ((pGVar2->TargetPressure).super_ParameterBase.empty_ == true) {
    memcpy(&painCave,"NPT error: You can\'t use the NPT integrator\n   without a targetPressure!\n",
           0x4a);
    painCave.isFatal = 1;
    simError();
  }
  else {
    this->targetPressure = (pGVar2->TargetPressure).data_;
  }
  if ((pGVar2->TauBarostat).super_ParameterBase.empty_ == true) {
    builtin_strncpy(painCave.errMsg + 0x30,"arostat.\n",10);
    builtin_strncpy(painCave.errMsg + 0x20,"ou must set tauB",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"PT integrator, y",0x10);
    builtin_strncpy(painCave.errMsg,"If you use the N",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->tauBarostat = (pGVar2->TauBarostat).data_;
  }
  dVar4 = this->tauThermostat * this->tauThermostat;
  dVar5 = this->tauBarostat * this->tauBarostat;
  auVar3._8_4_ = SUB84(dVar5,0);
  auVar3._0_8_ = dVar4;
  auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
  this->tt2 = dVar4;
  this->tb2 = (RealType)auVar3._8_8_;
  Integrator::updateSizes((Integrator *)this);
  return;
}

Assistant:

NPT::NPT(SimInfo* info) :
      VelocityVerletIntegrator(info), etaTolerance(1e-6), chiTolerance(1e-6),
      maxIterNum_(4) {
    Globals* simParams = info_->getSimParams();

    if (!simParams->getUseIntialExtendedSystemState()) {
      Snapshot* currSnapshot =
          info_->getSnapshotManager()->getCurrentSnapshot();
      currSnapshot->setThermostat(make_pair(0.0, 0.0));
      currSnapshot->setBarostat(Mat3x3d(0.0));
    }

    if (!simParams->haveTargetTemp()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "You can't use the NVT integrator without a targetTemp!\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    } else {
      targetTemp = simParams->getTargetTemp();
    }

    // We must set tauThermostat
    if (!simParams->haveTauThermostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the constant temperature\n"
               "\tintegrator, you must set tauThermostat.\n");

      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauThermostat = simParams->getTauThermostat();
    }

    if (!simParams->haveTargetPressure()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPT error: You can't use the NPT integrator\n"
               "   without a targetPressure!\n");

      painCave.isFatal = 1;
      simError();
    } else {
      targetPressure = simParams->getTargetPressure();
    }

    if (!simParams->haveTauBarostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the NPT integrator, you must set tauBarostat.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauBarostat = simParams->getTauBarostat();
    }

    tt2 = tauThermostat * tauThermostat;
    tb2 = tauBarostat * tauBarostat;

    updateSizes();
  }